

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O2

void __thiscall Solver::solveBFS(Solver *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  string *__k;
  pointer pBVar2;
  Block block;
  Block block_00;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  bool bVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  int iVar15;
  Solver *pSVar16;
  ulong uVar17;
  deque<Board,_std::allocator<Board>_> boards;
  Board tempBoard;
  Board board;
  Board local_2e8;
  Board local_200;
  Board local_118;
  
  std::_Deque_base<Board,_std::allocator<Board>_>::_Deque_base
            (&boards.super__Deque_base<Board,_std::allocator<Board>_>);
  std::deque<Board,_std::allocator<Board>_>::push_back
            ((deque<Board,_std::allocator<Board>_> *)
             &boards.super__Deque_base<Board,_std::allocator<Board>_>,&this->board);
  this_00 = &this->pastSteps;
  __k = &tempBoard.identifier;
  p_Var1 = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
  do {
    if (boards.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        boards.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur) break;
    Board::Board(&board,boards.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur);
    std::deque<Board,_std::allocator<Board>_>::pop_front(&boards);
    bVar11 = Board::isCompleted(&board);
    if (bVar11) {
      Board::Board(&local_2e8,&board);
      constructSolutionSteps(this,&local_2e8);
      Board::~Board(&local_2e8);
    }
    else {
      uVar17 = 0;
      while( true ) {
        if ((ulong)(((long)board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x14) <= uVar17) break;
        bVar12 = Block::isHorizontal(board.blocks.super__Vector_base<Block,_std::allocator<Block>_>.
                                     _M_impl.super__Vector_impl_data._M_start + uVar17);
        if (bVar12) {
          for (iVar15 = 0; iVar15 != 2; iVar15 = iVar15 + 1) {
            pBVar2 = board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar17;
            uVar3 = pBVar2->id;
            uVar4 = pBVar2->row;
            uVar5 = pBVar2->column;
            uVar6 = pBVar2->length;
            block.length = uVar6;
            block.column = uVar5;
            block.row = uVar4;
            block.id = uVar3;
            block.direction =
                 board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17].direction;
            bVar12 = Board::canMove(&board,block,iVar15);
            if (bVar12) {
              pSVar16 = (Solver *)&board;
              Board::Board(&local_118,&board);
              createMovedInstance(&tempBoard,pSVar16,&local_118,(int)uVar17,iVar15);
              Board::~Board(&local_118);
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                       ::find(&this_00->_M_t,__k);
              if ((_Rb_tree_header *)iVar13._M_node == p_Var1) {
                pmVar14 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                          ::operator[](this_00,__k);
                Board::operator=(pmVar14,&tempBoard);
                std::deque<Board,_std::allocator<Board>_>::push_back(&boards,&tempBoard);
              }
              Board::~Board(&tempBoard);
            }
          }
        }
        else {
          for (iVar15 = 2; iVar15 != 4; iVar15 = iVar15 + 1) {
            pBVar2 = board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar17;
            uVar7 = pBVar2->id;
            uVar8 = pBVar2->row;
            uVar9 = pBVar2->column;
            uVar10 = pBVar2->length;
            block_00.length = uVar10;
            block_00.column = uVar9;
            block_00.row = uVar8;
            block_00.id = uVar7;
            block_00.direction =
                 board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17].direction;
            bVar12 = Board::canMove(&board,block_00,iVar15);
            if (bVar12) {
              pSVar16 = (Solver *)&board;
              Board::Board(&local_200,&board);
              createMovedInstance(&tempBoard,pSVar16,&local_200,(int)uVar17,iVar15);
              Board::~Board(&local_200);
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                       ::find(&this_00->_M_t,__k);
              if ((_Rb_tree_header *)iVar13._M_node == p_Var1) {
                pmVar14 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                          ::operator[](this_00,__k);
                Board::operator=(pmVar14,&tempBoard);
                std::deque<Board,_std::allocator<Board>_>::push_back(&boards,&tempBoard);
              }
              Board::~Board(&tempBoard);
            }
          }
        }
        uVar17 = uVar17 + 1;
      }
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                ::operator[](this_00,&board.identifier);
      Board::operator=(pmVar14,&board);
    }
    Board::~Board(&board);
  } while (!bVar11);
  std::deque<Board,_std::allocator<Board>_>::~deque(&boards);
  return;
}

Assistant:

void Solver::solveBFS() {
    deque<Board> boards;
    boards.push_back(this->board);

    // Loop over the queue until either the queue is empty or the solution is found.
    while (!boards.empty()) {

        // Get the next board and remove it from the list.
        Board board = boards.front();
        boards.pop_front();

        // Check if the board is solved completely.
        if (board.isCompleted()) {

            // The board is completed construct the solution steps.
            this->constructSolutionSteps(board);
            return;
        }

        // Construct the possible movement boards and push to the queue.
        for (int i = 0; i < board.blocks.size(); ++i) {
            if (board.blocks[i].isHorizontal()) {
                for (int j = LEFT; j <= RIGHT; ++j) {
                    // If the board can move, create the moved instance with appropriate referrer and identifier numbers.
                    if (board.canMove(board.blocks[i], j)) {
                        Board tempBoard = this->createMovedInstance(board, i, j);
                        if (this->pastSteps.find(tempBoard.identifier) == this->pastSteps.end()) {
                            this->pastSteps[tempBoard.identifier] = tempBoard;
                            boards.push_back(tempBoard);
                        }
                    }
                }
            } else {
                for (int j = UP; j <= DOWN; ++j) {
                    // If the board can move, create the moved instance with appropriate referrer and identifier numbers.
                    if (board.canMove(board.blocks[i], j)) {
                        Board tempBoard = this->createMovedInstance(board, i, j);
                        if (this->pastSteps.find(tempBoard.identifier) == this->pastSteps.end()) {
                            this->pastSteps[tempBoard.identifier] = tempBoard;
                            boards.push_back(tempBoard);
                        }
                    }
                }
            }
        }

        // Move the board to the past steps.
        this->pastSteps[board.identifier] = board;
    }
}